

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O1

size_t bssl::dtls_max_seal_overhead(SSL *ssl,uint16_t epoch)

{
  byte bVar1;
  DTLS1_STATE *pDVar2;
  uint16_t uVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  DTLSWriteEpoch *pDVar7;
  
  pDVar2 = ssl->d1;
  if (*(uint16_t *)((long)&(pDVar2->write_epoch).next_record.combined_ + 6) == epoch) {
    pDVar7 = &pDVar2->write_epoch;
  }
  else {
    bVar1 = (pDVar2->extra_write_epochs).size_;
    if (bVar1 != 0) {
      lVar6 = 0;
      do {
        pDVar7 = *(DTLSWriteEpoch **)((pDVar2->extra_write_epochs).storage_ + lVar6);
        if (*(uint16_t *)((long)&(pDVar7->next_record).combined_ + 6) == epoch) goto LAB_00170937;
        lVar6 = lVar6 + 8;
      } while ((ulong)bVar1 * 8 != lVar6);
    }
    pDVar7 = (DTLSWriteEpoch *)0x0;
  }
LAB_00170937:
  if (pDVar7 == (DTLSWriteEpoch *)0x0) {
    sVar4 = 0;
  }
  else {
    if (ssl->s3->version == 0) {
      lVar6 = 0xd;
    }
    else {
      uVar3 = ssl_protocol_version(ssl);
      lVar6 = 0xd;
      if (epoch != 0) {
        lVar6 = (ulong)(uVar3 < 0x304) * 8 + 5;
      }
    }
    sVar4 = SSLAEADContext::MaxOverhead
                      ((pDVar7->aead)._M_t.
                       super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl);
    if (ssl->s3->version == 0) {
      uVar5 = 0;
    }
    else {
      uVar3 = ssl_protocol_version(ssl);
      uVar5 = (ulong)(epoch != 0 && 0x303 < uVar3);
    }
    sVar4 = sVar4 + lVar6 + uVar5;
  }
  return sVar4;
}

Assistant:

size_t dtls_max_seal_overhead(const SSL *ssl, uint16_t epoch) {
  DTLSWriteEpoch *write_epoch = dtls_get_write_epoch(ssl, epoch);
  if (write_epoch == nullptr) {
    return 0;
  }
  size_t ret = dtls_record_header_write_len(ssl, epoch) +
               write_epoch->aead->MaxOverhead();
  if (use_dtls13_record_header(ssl, epoch)) {
    // Add 1 byte for the encrypted record type.
    ret++;
  }
  return ret;
}